

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall asl::SockClientThread::run(SockClientThread *this)

{
  SocketServer *pSVar1;
  int __fd;
  Socket local_18;
  SockClientThread *local_10;
  SockClientThread *this_local;
  Socket *this_00;
  
  pSVar1 = this->_server;
  this_00 = &local_18;
  local_10 = this;
  Socket::Socket(this_00,&this->_client);
  (**pSVar1->_vptr_SocketServer)();
  __fd = (int)this_00;
  Socket::~Socket(&local_18);
  Socket::close(&this->_client,__fd);
  AtomicCount::operator--(&this->_server->_numClients);
  if (this != (SockClientThread *)0x0) {
    (*(this->super_Thread)._vptr_Thread[1])();
  }
  return;
}

Assistant:

void run()
	{
		_server->serve(_client);
		_client.close();
		--_server->_numClients;
		delete this;
	}